

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O0

void Abc_ObjChangePerform
               (Abc_Obj_t *pObj,Vec_Int_t *vInfo,Vec_Int_t *vFirst,int fUseInv,Vec_Int_t *vTemp,
               Vec_Ptr_t *vFanout,Vec_Ptr_t *vFanout2,Mio_Cell2_t *pCells)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pFanin;
  int local_70;
  int iFanin;
  int k;
  int i;
  int *pNodeInfo;
  int *pFanInfo;
  int iNodeCell;
  int iFanCell;
  Abc_Obj_t *pNodeInv;
  Abc_Obj_t *pNext2;
  Abc_Obj_t *pNext;
  Vec_Ptr_t *vFanout_local;
  Vec_Int_t *vTemp_local;
  int fUseInv_local;
  Vec_Int_t *vFirst_local;
  Vec_Int_t *vInfo_local;
  Abc_Obj_t *pObj_local;
  
  _iNodeCell = (Abc_Obj_t *)0x0;
  iVar1 = Mio_GateReadCell((Mio_Gate_t *)(pObj->field_5).pData);
  iVar1 = Vec_IntEntry(vFirst,iVar1);
  piVar3 = Vec_IntEntryP(vInfo,iVar1);
  iVar1 = Abc_ObjFaninNum(pObj);
  if ((iVar1 < 1) || (piVar3[iVar1 * 3] == -1)) {
    __assert_fail("iFanin > 0 && pNodeInfo[3*iFanin] != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmArea.c"
                  ,0x11f,
                  "void Abc_ObjChangePerform(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Mio_Cell2_t *)"
                 );
  }
  Abc_NodeCollectFanouts(pObj,vFanout);
  iVar2 = Abc_NodeIsInv(pObj);
  if (iVar2 == 0) {
    Abc_ObjChangeUpdate(pObj,iVar1,pCells,piVar3,vTemp);
    vInfo_local = (Vec_Int_t *)pObj;
  }
  else {
    vInfo_local = (Vec_Int_t *)Abc_ObjFanin0(pObj);
    for (local_70 = 0; iVar1 = Vec_PtrSize(vFanout), local_70 < iVar1; local_70 = local_70 + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vFanout,local_70);
      Abc_ObjPatchFanin(pAVar4,pObj,(Abc_Obj_t *)vInfo_local);
    }
    iVar1 = Abc_ObjFanoutNum(pObj);
    if (iVar1 != 0) {
      __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmArea.c"
                    ,0x127,
                    "void Abc_ObjChangePerform(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Mio_Cell2_t *)"
                   );
    }
    Abc_NtkDeleteObj(pObj);
  }
  if (fUseInv != 0) {
    _iNodeCell = Abc_NtkCreateNodeInv(*(Abc_Ntk_t **)vInfo_local,(Abc_Obj_t *)vInfo_local);
  }
  iFanin = 0;
  do {
    iVar1 = Vec_PtrSize(vFanout);
    if (iVar1 <= iFanin) {
      return;
    }
    pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vFanout,iFanin);
    iVar1 = Abc_ObjIsNode(pAVar4);
    if ((iVar1 == 0) || (iVar1 = Abc_NodeIsBuf(pAVar4), iVar1 != 0)) {
      Abc_ObjPatchFanin(pAVar4,(Abc_Obj_t *)vInfo_local,_iNodeCell);
    }
    else {
      iVar1 = Abc_NodeIsInv(pAVar4);
      if (iVar1 == 0) {
        iVar1 = Abc_NodeFindFanin(pAVar4,(Abc_Obj_t *)vInfo_local);
        iVar2 = Mio_GateReadCell((Mio_Gate_t *)(pAVar4->field_5).pData);
        iVar2 = Vec_IntEntry(vFirst,iVar2);
        piVar3 = Vec_IntEntryP(vInfo,iVar2);
        if (piVar3[iVar1 * 3] == -1) {
          Abc_ObjPatchFanin(pAVar4,(Abc_Obj_t *)vInfo_local,_iNodeCell);
        }
        else {
          Abc_ObjChangeUpdate(pAVar4,iVar1,pCells,piVar3,vTemp);
        }
      }
      else {
        Abc_NodeCollectFanouts(pAVar4,vFanout2);
        for (local_70 = 0; iVar1 = Vec_PtrSize(vFanout2), local_70 < iVar1; local_70 = local_70 + 1)
        {
          pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(vFanout2,local_70);
          Abc_ObjPatchFanin(pObj_00,pAVar4,(Abc_Obj_t *)vInfo_local);
        }
        iVar1 = Abc_ObjFanoutNum(pAVar4);
        if (iVar1 != 0) {
          __assert_fail("Abc_ObjFanoutNum(pNext) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmArea.c"
                        ,0x13e,
                        "void Abc_ObjChangePerform(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Mio_Cell2_t *)"
                       );
        }
        Abc_NtkDeleteObj(pAVar4);
      }
    }
    iFanin = iFanin + 1;
  } while( true );
}

Assistant:

void Abc_ObjChangePerform( Abc_Obj_t * pObj, Vec_Int_t * vInfo, Vec_Int_t * vFirst, int fUseInv, Vec_Int_t * vTemp, Vec_Ptr_t * vFanout, Vec_Ptr_t * vFanout2, Mio_Cell2_t * pCells )
{
    Abc_Obj_t * pNext, * pNext2, * pNodeInv = NULL;
    int iFanCell, iNodeCell = Mio_GateReadCell( (Mio_Gate_t *)pObj->pData );
    int * pFanInfo, * pNodeInfo = Vec_IntEntryP( vInfo, Vec_IntEntry(vFirst, iNodeCell) );
    int i, k, iFanin = Abc_ObjFaninNum(pObj);
    assert( iFanin > 0 && pNodeInfo[3*iFanin] != -1 );
    // update the node
    Abc_NodeCollectFanouts( pObj, vFanout );
    if ( Abc_NodeIsInv(pObj) )
    {
        Abc_Obj_t * pFanin = Abc_ObjFanin0(pObj);
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanout, pNext, k )
            Abc_ObjPatchFanin( pNext, pObj, pFanin );
        assert( Abc_ObjFanoutNum(pObj) == 0 );
        Abc_NtkDeleteObj(pObj);
        pObj = pFanin;
//        assert( fUseInv == 0 );
    }
    else
        Abc_ObjChangeUpdate( pObj, iFanin, pCells, pNodeInfo, vTemp );
    // add inverter if needed
    if ( fUseInv )
        pNodeInv = Abc_NtkCreateNodeInv(pObj->pNtk, pObj);
    // update the fanouts
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanout, pNext, i )
    {
        if ( !Abc_ObjIsNode(pNext) || Abc_NodeIsBuf(pNext) )
        {
            Abc_ObjPatchFanin( pNext, pObj, pNodeInv );
            continue;
        }
        if ( Abc_NodeIsInv(pNext) )
        {
            Abc_NodeCollectFanouts( pNext, vFanout2 );
            Vec_PtrForEachEntry( Abc_Obj_t *, vFanout2, pNext2, k )
                Abc_ObjPatchFanin( pNext2, pNext, pObj );
            assert( Abc_ObjFanoutNum(pNext) == 0 );
            Abc_NtkDeleteObj(pNext);
            continue;
        }
        iFanin   = Abc_NodeFindFanin( pNext, pObj );
        iFanCell = Mio_GateReadCell( (Mio_Gate_t *)pNext->pData );
        pFanInfo = Vec_IntEntryP( vInfo, Vec_IntEntry(vFirst, iFanCell) );
        if ( pFanInfo[3*iFanin] == -1 )
        {
            Abc_ObjPatchFanin( pNext, pObj, pNodeInv );
            continue;
        }
        Abc_ObjChangeUpdate( pNext, iFanin, pCells, pFanInfo, vTemp );
    }
}